

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1M1P<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  float *pfVar1;
  float *pfVar2;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar3;
  ostream *poVar4;
  ReturnType_conflict RVar5;
  ResScalar RVar6;
  float fVar7;
  float fVar8;
  Matrix<float,_3,_1,_0,_3,_1> n2;
  Matrix<float,_3,_1,_0,_3,_1> n1;
  Matrix<float,_4,_4,_0,_4,_4> TV1;
  Scalar local_688;
  Scalar local_684;
  Scalar local_680;
  Matrix<float,_3,_1,_0,_3,_1> dir2;
  Matrix<float,_3,_1,_0,_3,_1> dir1;
  Matrix<float,_3,_1,_0,_3,_1> w2;
  Matrix<float,_3,_1,_0,_3,_1> p2;
  Matrix<float,_3,_1,_0,_3,_1> p1;
  Matrix<float,_3,_1,_0,_3,_1> m2;
  Matrix<float,_3,_1,_0,_3,_1> m1;
  Matrix<float,_4,_4,_0,_4,_4> TV2;
  Matrix<float,_6,_6,_0,_6,_6> TuL1;
  Matrix<float,_4,_4,_0,_4,_4> sol;
  Matrix<float,_4,_1,_0,_4,_1> NuU;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines1;
  Scalar local_4f0;
  Scalar local_4ec;
  Scalar local_4e8;
  Matrix<float,_3,_1,_0,_3,_1> w;
  Matrix<float,_4,_4,_0,_4,_4> Tu1;
  _Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_490;
  Matrix<float,_4,_4,_0,_4,_4> Tu2;
  Matrix<float,_4,_1,_0,_4,_1> PiU;
  Matrix<float,_4,_1,_0,_4,_1> Nu;
  Matrix<float,_4,_1,_0,_4,_1> Pi;
  Matrix<float,_6,_6,_0,_6,_6> TuL2;
  Matrix<float,_3,_1,_0,_3,_1> local_370;
  Matrix<float,_3,_1,_0,_3,_1> local_364;
  Matrix<float,_4,_4,_0,_4,_4> TU2;
  Matrix<float,_4,_1,_0,_4,_1> Nuu;
  Matrix<float,_4,_1,_0,_4,_1> Piu;
  Matrix<float,_4,_4,_0,_4,_4> TU1;
  Matrix<float,_6,_1,_0,_6,_1> lu2;
  Matrix<float,_6,_1,_0,_6,_1> lu1;
  Matrix<float,_6,_1,_0,_6,_1> lU2;
  Matrix<float,_6,_1,_0,_6,_1> lU1;
  undefined8 local_258;
  Matrix<float,_4,_4,_0,_4,_4> *local_250;
  Matrix<float,_4,_4,_0,_4,_4> *local_248;
  Matrix<float,_4,_4,_0,_4,_4> *local_240;
  Matrix<float,_4,_4,_0,_4,_4> *local_238;
  Matrix<float,_4,_4,_0,_4,_4> *local_230;
  Matrix<float,_3,_1,_0,_3,_1> local_228;
  Matrix<float,_3,_1,_0,_3,_1> local_218;
  Matrix<float,_3,_3,_0,_3,_3> V2;
  Matrix<float,_4,_1,_0,_4,_1> local_1e8;
  Matrix<float,_4,_1,_0,_4,_1> local_1d8;
  Matrix<float,_6,_6,_0,_6,_6> TUL2;
  Matrix<float,_3,_3,_0,_3,_3> V1;
  Matrix<float,_6,_6,_0,_6,_6> TUL1;
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_78;
  
  pfVar1 = *(float **)lCPair;
  if ((*(float **)(lCPair + 8) == pfVar1) &&
     ((ulong)(*(long *)(plPair + 8) - *(long *)plPair) < 0x21)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Solver 1M1P requires at least 1 line and 1 plane correspondence!");
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(-1);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pfVar2 = *(float **)plPair;
  Pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
       *(undefined8 *)pfVar2;
  Pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
       *(undefined8 *)(pfVar2 + 2);
  Nu.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
       *(undefined8 *)(pfVar2 + 4);
  Nu.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
       *(undefined8 *)(pfVar2 + 6);
  local_78.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._0_8_ = *(undefined8 *)pfVar1;
  local_78.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._8_8_ = *(undefined8 *)(pfVar1 + 2);
  local_78.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar1 + 4);
  local_78.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar1 + 6);
  local_78.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar1 + 8);
  local_78.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar1 + 10);
  local_78.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._0_8_ = *(undefined8 *)(pfVar1 + 0xc);
  local_78.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._8_8_ = *(undefined8 *)(pfVar1 + 0xe);
  getPluckerCoord<float>(&lines1,&local_78);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&TUL1,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Pi,3);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&TUL2,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             lines1.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,3);
  RVar5 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::
          dot<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TUL1,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *
                     )&TUL2);
  if (1e-06 <= ABS(RVar5)) {
    local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = Pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
    local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = Pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
    local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = Pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
    local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = Pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
    local_1e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = Nu.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
    local_1e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = Nu.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
    local_1e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = Nu.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
    local_1e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = Nu.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
    getPredefinedTransformations1Plane3Line<float>
              ((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)&local_490,&local_1d8,&local_1e8,false);
    TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)
          local_490._M_impl.super__Vector_impl_data._M_finish[-1].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
    TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
    TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._16_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4);
    TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._24_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6);
    TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._32_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8);
    TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._40_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10);
    TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._48_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc)
    ;
    TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._56_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe)
    ;
    TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)
          local_490._M_impl.super__Vector_impl_data._M_finish[-2].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
    TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
    TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._16_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4);
    TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._24_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6);
    TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._32_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8);
    TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._40_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10);
    TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._48_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc)
    ;
    TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._56_8_ =
         *(undefined8 *)
          (local_490._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe)
    ;
    local_490._M_impl.super__Vector_impl_data._M_finish =
         local_490._M_impl.super__Vector_impl_data._M_finish + -2;
    Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
              ((PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>> *)&TUL1,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
                *)&TUL2);
    Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
              ((PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>> *)&TUL2,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
                *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TuL1,&TU1,3,3)
    ;
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)&TuL2,&TUL1,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TuL2,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TuL1,&TU1,3,3)
    ;
    Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TuL2,&TUL1,3,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TuL2,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
              ((Type *)&TuL2,&TU1,3,1);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_364,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)&TuL2
              );
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)&TV1,&local_364);
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         &TV1;
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&Tu1,&TU1,3,3);
    Eigen::
    Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&TuL1,(Lhs *)&TV2,(Rhs *)&Tu1);
    Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&Tu2,&TUL1,3,0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&Tu2,
               (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TuL1,&TU2,3,3)
    ;
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)&TuL2,&TUL2,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TuL2,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TuL1,&TU2,3,3)
    ;
    Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TuL2,&TUL2,3,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TuL2,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
              ((Type *)&TuL2,&TU2,3,1);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_370,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)&TuL2
              );
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)&TV1,&local_370);
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         &TV1;
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&Tu1,&TU2,3,3);
    Eigen::
    Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&TuL1,(Lhs *)&TV2,(Rhs *)&Tu1);
    Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&Tu2,&TUL2,3,0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&Tu2,
               (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&TuL1);
    TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ =
         lines1.
         super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
         &TUL1;
    Eigen::PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>> *)&lU1,
               (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)&TuL1);
    TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ =
         lines1.
         super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
    TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
         &TUL2;
    Eigen::PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>> *)&lU2,
               (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)&TuL1);
    TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
         &TU1;
    TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ =
         (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Pi;
    Eigen::PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>,Eigen::Matrix<float,4,1,0,4,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>> *)&PiU,
               (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
                *)&TuL1);
    TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
         &TU2;
    TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ =
         &Nu;
    Eigen::PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>,Eigen::Matrix<float,4,1,0,4,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>> *)&NuU,
               (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
                *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TuL1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&lU1,3);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&dir1,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TuL1)
    ;
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TuL1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&lU1,3);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&m1,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TuL1)
    ;
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TuL1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&lU2,3);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&dir2,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TuL1)
    ;
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TuL1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&lU2,3);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&m2,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TuL1)
    ;
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TuL1,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&PiU,3);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&n1,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)&TuL1)
    ;
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TuL1,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&NuU,3);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&n2,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)&TuL1)
    ;
    Tu2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
         n1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
         m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         n1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    Tu2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         n1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
         n1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    Tu2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
         n1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
         n1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
         m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                      *)&Tu1,PiU.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                             m_storage.m_data.array + 3,(StorageBaseType *)&dir1);
    TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
         Tu1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2];
    TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
         Tu1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4];
    TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
         Tu1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5];
    TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
         &Tu2;
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         Eigen::internal::
         dot_nocheck<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_false>
         ::run((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&n1,
               (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&dir1);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>>
    ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                 *)&TuL1,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>>
                          *)&TuL2,(float *)&TV1);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&p1,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                *)&TuL1);
    Tu2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
         n2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
         m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         n2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    Tu2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         n2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
         n2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    Tu2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
         n2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
         n2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
         m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                      *)&Tu1,NuU.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                             m_storage.m_data.array + 3,(StorageBaseType *)&dir2);
    TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
         Tu1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2];
    TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
         Tu1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4];
    TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
         Tu1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5];
    TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
         &Tu2;
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         Eigen::internal::
         dot_nocheck<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_false>
         ::run((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&n2,
               (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&dir2);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>>
    ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                 *)&TuL1,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>>
                          *)&TuL2,(float *)&TV1);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&p2,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                *)&TuL1);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&Tu1,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
              ((Type *)&TuL1,&Tu1,3,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1,&p1);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&Tu2,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
              ((Type *)&TuL1,&Tu2,3,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1,&p2);
    Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
              ((PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>> *)&TuL1,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
                *)&TuL2);
    Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
              ((PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>> *)&TuL2,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
                *)&TV1);
    local_218.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = p1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    local_218.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = p1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    local_218.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = p1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)&TV2,&local_218);
    sol.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         &TV2;
    Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TV1,&TuL1,3,0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TV1,
               (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                *)&sol);
    local_228.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    local_228.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    local_228.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)&TV2,&local_228);
    sol.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         &TV2;
    Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TV1,&TuL2,3,0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TV1,
               (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                *)&sol);
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         &TuL1;
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&lU1;
    Eigen::PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>> *)&lu1,
               (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)&TV1);
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         &TuL2;
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&lU2;
    Eigen::PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>> *)&lu2,
               (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)&TV1);
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         &Tu1;
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&PiU;
    Eigen::PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>,Eigen::Matrix<float,4,1,0,4,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>> *)&Piu,
               (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
                *)&TV1);
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         &Tu2;
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         &NuU;
    Eigen::PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>,Eigen::Matrix<float,4,1,0,4,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>> *)&Nuu,
               (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
                *)&TV1);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TV1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&lu1,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
              (&dir1,(Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TV1);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TV1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&lu1,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
              (&m1,(Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TV1);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TV1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&lu2,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
              (&dir2,(Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TV1);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TV1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&lu2,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
              (&m2,(Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TV1);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TV1,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Piu,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
              (&n1,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&TV1);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TV1,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Nuu,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
              (&n2,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&TV1);
    RVar6 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_false>
            ::run((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&dir1,
                  (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&n1);
    sol.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         RVar6;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                      *)&TV2,(float *)&sol,(StorageBaseType *)&n1);
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
         TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2];
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
         TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4];
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
         TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5];
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&dir1;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
    ::normalized((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                  *)&w);
    fVar7 = atan2f(w.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1],w.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[0]);
    V1.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         cosf(fVar7);
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         &V1;
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] = 0.0;
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] = 0.0;
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
         1.4013e-45;
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] = 0.0;
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
         1.4013e-45;
    TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] = 0.0;
    fVar8 = sinf(fVar7);
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         fVar8;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&TV1,
                        (Scalar *)&TV2);
    sol.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar3,(Scalar *)&sol);
    fVar8 = sinf(fVar7);
    local_258._0_4_ = -fVar8;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar3,(Scalar *)&local_258);
    V2.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         cosf(fVar7);
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar3,(Scalar *)&V2);
    w2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar3,(Scalar *)&w2);
    local_680 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar3,&local_680);
    local_684 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar3,&local_684);
    local_688 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_688);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::finished
              ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&TV1);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&TV1,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)&TV2);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TV2,&TV1,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
              ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TV2,&V1);
    local_258._0_4_ =
         Eigen::internal::
         dot_nocheck<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_false>
         ::run((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&dir2,
               (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&n2);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                      *)&sol,(float *)&local_258,(StorageBaseType *)&n2);
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
         sol.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2];
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
         sol.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4];
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
         sol.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5];
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&dir2;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
    ::normalized((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                  *)&w2);
    fVar7 = atan2f(w2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1],w2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                            .m_data.array[0]);
    V2.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         cosf(fVar7);
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] = 0.0;
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] = 0.0;
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
         1.4013e-45;
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] = 0.0;
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
         1.4013e-45;
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] = 0.0;
    TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         &V2;
    sol.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         sinf(fVar7);
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&TV2,
                        (Scalar *)&sol);
    local_258 = (Matrix<float,_4,_4,_0,_4,_4> *)((ulong)local_258._4_4_ << 0x20);
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar3,(Scalar *)&local_258);
    local_680 = sinf(fVar7);
    local_680 = -local_680;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar3,&local_680);
    local_684 = cosf(fVar7);
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar3,&local_684);
    local_688 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar3,&local_688);
    local_4e8 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar3,&local_4e8);
    local_4ec = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar3,&local_4ec);
    local_4f0 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_4f0);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::finished
              ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&TV2);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&TV2,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)&sol);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&sol,&TV2,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
              ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&sol,&V2);
    local_258 = &TU2;
    local_250 = &Tu2;
    local_238 = &Tu1;
    local_248 = &TV2;
    local_240 = &TV1;
    local_230 = &TU1;
    Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
    _set_noalias<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&sol,
               (DenseBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                *)&local_258);
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::push_back(__return_storage_ptr__,&sol);
    std::
    _Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::~_Vector_base(&local_490);
  }
  std::
  _Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::~_Vector_base(&lines1.
                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M1P(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){

	// check input vectors size
	if(lCPair.size() < 1 && plPair.size() < 2){
		std::cerr << "Solver 1M1P requires at least 1 line and 1 plane correspondence!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;
	out.clear();

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu;
	Pi = plPair[0].first; Nu = plPair[0].second;
	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);

	// check if line and plane are parallel
	if(abs(Pi.head(3).dot(lines1[0].head(3))) < 1e-6){
		// std::cout << Pi.head(3).transpose() << "   " << lines1[0].head(3).transpose() << std::endl; 
		// std::cout << lCPair[0].first.second.head(3).transpose() << "  " << lCPair[0].first.first.head(3).transpose() << std::endl;
		// std::cerr << "Solver 1M1P: The line and plane cannot be parallel!" << std::endl;
		return out;
		// exit(-1);
	}

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TU2 = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU1 = predTrans.back();
	predTrans.pop_back();

	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,4,1> PiU = TU1.transpose().inverse()*Pi;
	Eigen::Matrix<floatPrec,4,1> NuU = TU2.transpose().inverse()*Nu;
	
	// get direction and moment vectors
	Eigen::Matrix<floatPrec,3,1> dir1 = lU1.head(3), m1 = lU1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lU2.head(3), m2 = lU2.tail(3);
	Eigen::Matrix<floatPrec,3,1> n1 = PiU.head(3), n2 = NuU.head(3);

	// compute intersection line with plane
	Eigen::Matrix<floatPrec,3,1> p1 = (n1.cross(m1) - PiU(3)*dir1)/(n1.dot(dir1));
	Eigen::Matrix<floatPrec,3,1> p2 = (n2.cross(m2) - NuU(3)*dir2)/(n2.dot(dir2));

	Matrix<floatPrec, 4, 4> Tu1 = Matrix<floatPrec, 4, 4>::Identity();
	Tu1.topRightCorner(3,1) = p1;
	Matrix<floatPrec, 4, 4> Tu2 = Matrix<floatPrec, 4, 4>::Identity();
	Tu2.topRightCorner(3,1) = p2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(p1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(p2);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*lU1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*lU2;
	Eigen::Matrix<floatPrec,4,1> Piu = Tu1.transpose().inverse()*PiU;
	Eigen::Matrix<floatPrec,4,1> Nuu = Tu2.transpose().inverse()*NuU;

	// align x axis wiht projection of line direction to plane
	// project line direction to plane
	dir1 = lu1.head(3); m1 = lu1.tail(3);
	dir2 = lu2.head(3); m2 = lu2.tail(3);
	n1 = Piu.head(3); n2 = Nuu.head(3);
	// frame A
	Eigen::Matrix<floatPrec,3,1> w = (dir1 - dir1.dot(n1)*n1).normalized();
	floatPrec alpha1 = atan2(w(1),w(0));
	Eigen::Matrix<floatPrec,3,3> V1;
	V1 << cos(alpha1),sin(alpha1),0,-sin(alpha1),cos(alpha1),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV1.topLeftCorner(3,3) = V1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> w2 = (dir2 - dir2.dot(n2)*n2).normalized();
	floatPrec alpha2 = atan2(w2(1),w2(0));
	Eigen::Matrix<floatPrec,3,3> V2;
	V2 << cos(alpha2),sin(alpha2),0,-sin(alpha2),cos(alpha2),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV2.topLeftCorner(3,3) = V2;

	Eigen::Matrix<floatPrec,4,4> sol = TU2.inverse()*Tu2.inverse()*TV2.inverse()*TV1*Tu1*TU1;
	out.push_back(sol);

	return out;
}